

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

void __thiscall
Js::CustomExternalWrapperObject::CustomExternalWrapperObject
          (CustomExternalWrapperObject *this,CustomExternalWrapperObject *instance,bool deepCopy)

{
  int iVar1;
  Type TVar2;
  int iVar3;
  void *pvVar4;
  void *src;
  bool deepCopy_local;
  CustomExternalWrapperObject *instance_local;
  CustomExternalWrapperObject *this_local;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,&instance->super_DynamicObject,deepCopy);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dfe2a0;
  this->initialized = (Type)(instance->initialized & 1);
  SlotInfo::SlotInfo((SlotInfo *)&(this->u).slot);
  iVar1 = GetInlineSlotSize(instance);
  if (iVar1 == 0) {
    this->slotType = External;
    pvVar4 = GetInlineSlots(instance);
    Memory::WriteBarrierPtr<void>::operator=(&(this->u).slot,pvVar4);
  }
  else {
    this->slotType = Inline;
    TVar2 = GetInlineSlotSize(instance);
    (this->u).inlineSlotSize = TVar2;
    pvVar4 = GetInlineSlots(instance);
    if (pvVar4 != (void *)0x0) {
      pvVar4 = GetInlineSlots(this);
      iVar1 = GetInlineSlotSize(this);
      src = GetInlineSlots(instance);
      iVar3 = GetInlineSlotSize(instance);
      memcpy_s(pvVar4,(long)iVar1,src,(long)iVar3);
    }
  }
  return;
}

Assistant:

CustomExternalWrapperObject::CustomExternalWrapperObject(CustomExternalWrapperObject * instance, bool deepCopy) :
    Js::DynamicObject(instance, deepCopy),
    initialized(instance->initialized)
{
    if (instance->GetInlineSlotSize() != 0)
    {
        this->slotType = SlotType::Inline;
        this->u.inlineSlotSize = instance->GetInlineSlotSize();
        if (instance->GetInlineSlots())
        {
            memcpy_s(this->GetInlineSlots(), this->GetInlineSlotSize(), instance->GetInlineSlots(), instance->GetInlineSlotSize());
        }
    }
    else
    {
        this->slotType = SlotType::External;
        this->u.slot = instance->GetInlineSlots();
    }
}